

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall
cmTarget::AddLinkLibrary
          (cmTarget *this,cmMakefile *mf,string *target,string *lib,cmTargetLinkLibraryType llt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n;
  pointer pcVar3;
  cmMakefile *this_00;
  int iVar4;
  cmTarget *pcVar5;
  long *plVar6;
  size_type sVar7;
  char *pcVar8;
  size_type *psVar9;
  byte bVar10;
  string dependencies;
  string libName;
  LibraryID tmp;
  string local_a8;
  string local_88;
  value_type local_68;
  string *local_40;
  cmMakefile *local_38;
  
  bVar10 = 0;
  local_40 = target;
  local_38 = mf;
  pcVar5 = cmMakefile::FindTargetToUse(this->Makefile,lib,false);
  if (pcVar5 != (cmTarget *)0x0) {
    bVar10 = pcVar5->IsImportedTarget ^ 1;
  }
  if ((llt == GENERAL_LibraryType) || (bVar10 == 0)) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    pcVar3 = (lib->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar3,pcVar3 + lib->_M_string_length);
  }
  else {
    std::operator+(&local_68.first,"$<TARGET_NAME:",lib);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_88.field_2._M_allocated_capacity = *psVar9;
      local_88.field_2._8_8_ = plVar6[3];
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar9;
      local_88._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_88._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
      operator_delete(local_68.first._M_dataplus._M_p,
                      CONCAT71(local_68.first.field_2._M_allocated_capacity._1_7_,
                               local_68.first.field_2._M_local_buf[0]) + 1);
    }
  }
  paVar2 = &local_68.first.field_2;
  local_68.first._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"LINK_LIBRARIES","");
  GetDebugGeneratorExpressions(&local_a8,this,&local_88,llt);
  AppendProperty(this,&local_68.first,local_a8._M_dataplus._M_p,false);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.first._M_dataplus._M_p,
                    CONCAT71(local_68.first.field_2._M_allocated_capacity._1_7_,
                             local_68.first.field_2._M_local_buf[0]) + 1);
  }
  paVar2 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  sVar7 = cmGeneratorExpression::Find(lib);
  if (sVar7 != 0xffffffffffffffff) {
    return;
  }
  if ((pcVar5 != (cmTarget *)0x0) && (pcVar5->TargetTypeValue == INTERFACE_LIBRARY)) {
    return;
  }
  __n = local_40->_M_string_length;
  if (__n == lib->_M_string_length) {
    if (__n == 0) {
      return;
    }
    iVar4 = bcmp((local_40->_M_dataplus)._M_p,(lib->_M_dataplus)._M_p,__n);
    if (iVar4 == 0) {
      return;
    }
  }
  local_68.first._M_dataplus._M_p = (pointer)&local_68.first.field_2;
  local_68.first._M_string_length = 0;
  local_68.first.field_2._M_local_buf[0] = '\0';
  local_68.second = GENERAL_LibraryType;
  std::__cxx11::string::_M_assign((string *)&local_68);
  local_68.second = llt;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
  ::push_back(&this->OriginalLinkLibraries,&local_68);
  if (this->RecordDependencies == true) {
    pcVar3 = (local_40->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar3,pcVar3 + local_40->_M_string_length);
    std::__cxx11::string::append((char *)&local_88);
    this_00 = local_38;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    pcVar8 = cmMakefile::GetDefinition(local_38,&local_88);
    if (pcVar8 != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_a8);
    }
    if (llt < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
      std::__cxx11::string::append((char *)&local_a8);
    }
    std::__cxx11::string::append((char *)&local_a8);
    std::__cxx11::string::_M_append((char *)&local_a8,(ulong)(lib->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a8);
    cmMakefile::AddCacheDefinition
              (this_00,&local_88,local_a8._M_dataplus._M_p,"Dependencies for the target",STATIC,
               false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != &local_68.first.field_2) {
    operator_delete(local_68.first._M_dataplus._M_p,
                    CONCAT71(local_68.first.field_2._M_allocated_capacity._1_7_,
                             local_68.first.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf,
                              const std::string& target,
                              const std::string& lib,
                              cmTargetLinkLibraryType llt)
{
  cmTarget *tgt = this->Makefile->FindTargetToUse(lib);
  {
  const bool isNonImportedTarget = tgt && !tgt->IsImported();

  const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(lib)
      : lib;
  this->AppendProperty("LINK_LIBRARIES",
                       this->GetDebugGeneratorExpressions(libName,
                                                          llt).c_str());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos
      || (tgt && tgt->GetType() == cmState::INTERFACE_LIBRARY)
      || (target == lib ))
    {
    return;
    }

  cmTarget::LibraryID tmp;
  tmp.first = lib;
  tmp.second = llt;
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LinkLibrariesForVS6.push_back( tmp );
#endif
  this->OriginalLinkLibraries.push_back(tmp);

  // Add the explicit dependency information for this target. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if(this->RecordDependencies)
    {
    std::string targetEntry = target;
    targetEntry += "_LIB_DEPENDS";
    std::string dependencies;
    const char* old_val = mf.GetDefinition( targetEntry );
    if( old_val )
      {
      dependencies += old_val;
      }
    switch (llt)
      {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
      }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition( targetEntry, dependencies.c_str(),
                           "Dependencies for the target",
                           cmState::STATIC );
    }

}